

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

float * __thiscall
google::protobuf::RepeatedField<float>::Mutable(RepeatedField<float> *this,int index)

{
  LogMessage *pLVar1;
  float *pfVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x52a);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x52b);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pfVar2 = elements(this);
  return pfVar2 + index;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}